

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

uint spvc_compiler_msl_get_automatic_resource_binding_secondary
               (spvc_compiler compiler,spvc_variable_id id)

{
  spvc_context_s *this;
  uint32_t uVar1;
  allocator local_31;
  string local_30;
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    uVar1 = spirv_cross::CompilerMSL::get_automatic_msl_resource_binding_secondary
                      ((CompilerMSL *)
                       (compiler->compiler)._M_t.
                       super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                       .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,id);
    return uVar1;
  }
  this = compiler->context;
  std::__cxx11::string::string
            ((string *)&local_30,"MSL function used on a non-MSL backend.",&local_31);
  spvc_context_s::report_error(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return 0xffffffff;
}

Assistant:

unsigned spvc_compiler_msl_get_automatic_resource_binding_secondary(spvc_compiler compiler, spvc_variable_id id)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return uint32_t(-1);
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	return msl.get_automatic_msl_resource_binding_secondary(id);
#else
	(void)id;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return uint32_t(-1);
#endif
}